

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::DefaultsTest::Check
          (DefaultsTest *this,GLenum pname,GLint expected)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  long lStack_28;
  GLint result;
  Functions *gl;
  GLint expected_local;
  GLenum pname_local;
  DefaultsTest *this_local;
  
  gl._0_4_ = expected;
  gl._4_4_ = pname;
  _expected_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = 0;
  (**(code **)(lStack_28 + 0xba8))(this->m_vao,gl._4_4_,&local_2c);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"glGetVertexArrayiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xfc1);
  bVar4 = local_2c == (GLint)gl;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [43])"Default Vertex Array Object has parameter ");
    EVar5 = glu::getVertexAttribParameterNameStr(gl._4_4_);
    local_1d0[0].m_getName = EVar5.m_getName;
    local_1d0[0].m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x2affa57);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2a796ef);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [27])0x2a84efa);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return bVar4;
}

Assistant:

bool DefaultsTest::Check(const glw::GLenum pname, const glw::GLint expected)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint result = 0;

	gl.getVertexArrayiv(m_vao, pname, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetVertexArrayiv call failed.");

	if (result != expected)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Default Vertex Array Object has parameter "
											<< glu::getVertexAttribParameterNameStr(pname) << " equal to " << result
											<< ", but " << expected << " was expected. Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}